

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_createlngstrobj(lua_State *L,size_t l)

{
  TString *pTVar1;
  
  pTVar1 = createstrobj(L,l + 0x21,'\x14',L->l_G->seed);
  (pTVar1->u).lnglen = l;
  pTVar1->shrlen = -1;
  pTVar1->contents = (char *)&pTVar1->falloc;
  *(undefined1 *)((long)&pTVar1->falloc + l) = 0;
  return pTVar1;
}

Assistant:

TString *luaS_createlngstrobj (lua_State *L, size_t l) {
  size_t totalsize = luaS_sizelngstr(l, LSTRREG);
  TString *ts = createstrobj(L, totalsize, LUA_VLNGSTR, G(L)->seed);
  ts->u.lnglen = l;
  ts->shrlen = LSTRREG;  /* signals that it is a regular long string */
  ts->contents = cast_charp(ts) + offsetof(TString, falloc);
  ts->contents[l] = '\0';  /* ending 0 */
  return ts;
}